

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  wasm_extern_vec_t exports;
  wasm_byte_vec_t binary;
  wasm_extern_t *externs [1];
  wasm_byte_vec_t serialized;
  wasm_extern_vec_t imports;
  wasm_val_vec_t empty;
  long local_90;
  undefined8 *local_88;
  undefined1 local_80 [8];
  void *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("serialize.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar3 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_80,sVar3);
    sVar3 = fread(local_78,sVar3,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar4 = wasm_module_new(uVar2,local_80);
      if (lVar4 == 0) {
        pcVar9 = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(local_80);
        puts("Serializing module...");
        wasm_module_serialize(lVar4,local_68);
        wasm_module_delete(lVar4);
        puts("Deserializing module...");
        lVar4 = wasm_module_deserialize(uVar2,local_68);
        if (lVar4 == 0) {
          pcVar9 = "> Error deserializing module!";
        }
        else {
          wasm_byte_vec_delete(local_68);
          puts("Creating callback...");
          wasm_valtype_vec_new_empty(&local_58);
          wasm_valtype_vec_new_empty(&local_90);
          uVar5 = wasm_functype_new(&local_58,&local_90);
          uVar6 = wasm_func_new(uVar2,uVar5,hello_callback);
          wasm_functype_delete(uVar5);
          puts("Instantiating deserialized module...");
          local_70 = wasm_func_as_extern(uVar6);
          local_50 = &local_70;
          local_58 = 1;
          lVar7 = wasm_instance_new(uVar2,lVar4,&local_58,0);
          if (lVar7 == 0) {
            pcVar9 = "> Error instantiating module!";
          }
          else {
            wasm_func_delete(uVar6);
            puts("Extracting export...");
            wasm_instance_exports(lVar7,&local_90);
            if (local_90 == 0) {
              pcVar9 = "> Error accessing exports!";
            }
            else {
              lVar8 = wasm_extern_as_func(*local_88);
              if (lVar8 != 0) {
                wasm_module_delete(lVar4);
                wasm_instance_delete(lVar7);
                puts("Calling export...");
                local_48 = 0;
                uStack_40 = 0;
                lVar4 = wasm_func_call(lVar8,&local_48);
                if (lVar4 == 0) {
                  wasm_extern_vec_delete(&local_90);
                  puts("Shutting down...");
                  wasm_store_delete(uVar2);
                  wasm_engine_delete(uVar1);
                  pcVar9 = "Done.";
                }
                else {
                  pcVar9 = "> Error calling function!";
                }
                puts(pcVar9);
                return (uint)(lVar4 != 0);
              }
              pcVar9 = "> Error accessing export!";
            }
          }
        }
      }
      goto LAB_00101569;
    }
  }
  pcVar9 = "> Error loading module!";
LAB_00101569:
  puts(pcVar9);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("serialize.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Serialize module.
  printf("Serializing module...\n");
  own wasm_byte_vec_t serialized;
  wasm_module_serialize(module, &serialized);

  wasm_module_delete(module);

  // Deserialize module.
  printf("Deserializing module...\n");
  own wasm_module_t* deserialized = wasm_module_deserialize(store, &serialized);
  if (!deserialized) {
    printf("> Error deserializing module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&serialized);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* hello_type = wasm_functype_new_0_0();
  own wasm_func_t* hello_func =
    wasm_func_new(store, hello_type, hello_callback);

  wasm_functype_delete(hello_type);

  // Instantiate.
  printf("Instantiating deserialized module...\n");
  wasm_extern_t* externs[] = { wasm_func_as_extern(hello_func) };
  wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
  own wasm_instance_t* instance =
    wasm_instance_new(store, deserialized, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(hello_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(deserialized);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_vec_t empty = WASM_EMPTY_VEC;
  if (wasm_func_call(run_func, &empty, &empty)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}